

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  allocator local_219;
  string dir;
  string file;
  string saveFile;
  string local_1b8;
  string makeProgram;
  
  if ((this->FindMakeProgramFile)._M_string_length == 0) {
    cmSystemTools::Error
              ("Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::string((string *)&makeProgram,"CMAKE_MAKE_PROGRAM",(allocator *)&file);
  pcVar2 = cmMakefile::GetDefinition(mf,&makeProgram);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&makeProgram);
  }
  else {
    std::__cxx11::string::string((string *)&dir,"CMAKE_MAKE_PROGRAM",(allocator *)&saveFile);
    pcVar2 = cmMakefile::GetDefinition(mf,&dir);
    bVar1 = cmSystemTools::IsOff(pcVar2);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::~string((string *)&makeProgram);
    if (!bVar1) goto LAB_0026e5f1;
  }
  cmMakefile::GetModulesFile_abi_cxx11_
            (&makeProgram,mf,(this->FindMakeProgramFile)._M_dataplus._M_p);
  if (makeProgram._M_string_length != 0) {
    cmMakefile::ReadListFile(mf,makeProgram._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&makeProgram);
LAB_0026e5f1:
  std::__cxx11::string::string((string *)&makeProgram,"CMAKE_MAKE_PROGRAM",(allocator *)&file);
  pcVar2 = cmMakefile::GetDefinition(mf,&makeProgram);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&makeProgram);
  }
  else {
    std::__cxx11::string::string((string *)&dir,"CMAKE_MAKE_PROGRAM",(allocator *)&saveFile);
    pcVar2 = cmMakefile::GetDefinition(mf,&dir);
    bVar1 = cmSystemTools::IsOff(pcVar2);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::~string((string *)&makeProgram);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&dir,"CMAKE_MAKE_PROGRAM",(allocator *)&file);
      pcVar2 = cmMakefile::GetRequiredDefinition(mf,&dir);
      std::__cxx11::string::string((string *)&makeProgram,pcVar2,(allocator *)&saveFile);
      std::__cxx11::string::~string((string *)&dir);
      lVar3 = std::__cxx11::string::find((char)&makeProgram,0x20);
      if (lVar3 != -1) {
        dir._M_dataplus._M_p = (pointer)&dir.field_2;
        dir._M_string_length = 0;
        dir.field_2._M_local_buf[0] = '\0';
        file._M_dataplus._M_p = (pointer)&file.field_2;
        file._M_string_length = 0;
        file.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::SplitProgramPath(&makeProgram,&dir,&file,true);
        std::__cxx11::string::string((string *)&saveFile,(string *)&file);
        cmsys::SystemTools::GetShortPath(&makeProgram,&makeProgram);
        cmsys::SystemTools::SplitProgramPath(&makeProgram,&dir,&file,true);
        std::__cxx11::string::_M_assign((string *)&makeProgram);
        std::__cxx11::string::append((char *)&makeProgram);
        std::__cxx11::string::append((string *)&makeProgram);
        std::__cxx11::string::string((string *)&local_1b8,"CMAKE_MAKE_PROGRAM",&local_219);
        cmMakefile::AddCacheDefinition
                  (mf,&local_1b8,makeProgram._M_dataplus._M_p,"make program",FILEPATH,false);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&saveFile);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::~string((string *)&dir);
      }
      std::__cxx11::string::~string((string *)&makeProgram);
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&makeProgram);
  poVar4 = std::operator<<((ostream *)&makeProgram,
                           "CMake was unable to find a build program corresponding to \"");
  (*this->_vptr_cmGlobalGenerator[2])(&dir,this);
  poVar4 = std::operator<<(poVar4,(string *)&dir);
  poVar4 = std::operator<<(poVar4,"\".  CMAKE_MAKE_PROGRAM is not set.  You ");
  std::operator<<(poVar4,"probably need to select a different build tool.");
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(dir._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string((string *)&dir);
  cmSystemTools::s_FatalErrorOccured = true;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&makeProgram);
  return;
}

Assistant:

void cmGlobalGenerator::FindMakeProgram(cmMakefile* mf)
{
  if(this->FindMakeProgramFile.empty())
    {
    cmSystemTools::Error(
      "Generator implementation error, "
      "all generators must specify this->FindMakeProgramFile");
    }
  if(!mf->GetDefinition("CMAKE_MAKE_PROGRAM")
     || cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM")))
    {
    std::string setMakeProgram =
      mf->GetModulesFile(this->FindMakeProgramFile.c_str());
    if(!setMakeProgram.empty())
      {
      mf->ReadListFile(setMakeProgram.c_str());
      }
    }
  if(!mf->GetDefinition("CMAKE_MAKE_PROGRAM")
     || cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM")))
    {
    std::ostringstream err;
    err << "CMake was unable to find a build program corresponding to \""
        << this->GetName() << "\".  CMAKE_MAKE_PROGRAM is not set.  You "
        << "probably need to select a different build tool.";
    cmSystemTools::Error(err.str().c_str());
    cmSystemTools::SetFatalErrorOccured();
    return;
    }
  std::string makeProgram = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  // if there are spaces in the make program use short path
  // but do not short path the actual program name, as
  // this can cause trouble with VSExpress
  if(makeProgram.find(' ') != makeProgram.npos)
    {
    std::string dir;
    std::string file;
    cmSystemTools::SplitProgramPath(makeProgram,
                                    dir, file);
    std::string saveFile = file;
    cmSystemTools::GetShortPath(makeProgram, makeProgram);
    cmSystemTools::SplitProgramPath(makeProgram,
                                    dir, file);
    makeProgram = dir;
    makeProgram += "/";
    makeProgram += saveFile;
    mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", makeProgram.c_str(),
                           "make program",
                           cmState::FILEPATH);
    }
}